

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

istream * argo::operator>>(istream *stream,json *j)

{
  reader *local_20;
  
  parser::parse((parser *)&stack0xffffffffffffffe0,stream);
  json::operator=(j,(json *)local_20);
  if (local_20 != (reader *)0x0) {
    json::~json((json *)local_20);
    operator_delete(local_20);
  }
  return stream;
}

Assistant:

istream &NAMESPACE::operator>>(istream &stream, json &j)
{
    j = move(*parser::parse(stream));
    return stream;
}